

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_set_engine(Curl_easy *data,char *name)

{
  int iVar1;
  ulong error;
  char *pcVar2;
  char local_138 [8];
  char buf [256];
  ENGINE *local_30;
  ENGINE *e;
  CURLcode result;
  char *name_local;
  Curl_easy *data_local;
  
  e._4_4_ = CURLE_SSL_ENGINE_NOTFOUND;
  local_30 = ENGINE_by_id(name);
  if (local_30 == (ENGINE *)0x0) {
    data_local._4_4_ = ossl_set_provider(data,name);
  }
  else {
    if ((data->state).engine != (void *)0x0) {
      ENGINE_finish((ENGINE *)(data->state).engine);
      ENGINE_free((ENGINE *)(data->state).engine);
      (data->state).engine = (void *)0x0;
    }
    iVar1 = ENGINE_init(local_30);
    if (iVar1 == 0) {
      ENGINE_free(local_30);
      error = ERR_get_error();
      pcVar2 = ossl_strerror(error,local_138,0x100);
      Curl_failf(data,"Failed to initialise SSL Engine \'%s\': %s",name,pcVar2);
      e._4_4_ = CURLE_SSL_ENGINE_INITFAILED;
      local_30 = (ENGINE *)0x0;
    }
    (data->state).engine = local_30;
    data_local._4_4_ = e._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_set_engine(struct Curl_easy *data, const char *name)
{
#ifdef USE_OPENSSL_ENGINE
  CURLcode result = CURLE_SSL_ENGINE_NOTFOUND;
  ENGINE *e = ENGINE_by_id(name);

  if(e) {

    if(data->state.engine) {
      ENGINE_finish(data->state.engine);
      ENGINE_free(data->state.engine);
      data->state.engine = NULL;
    }
    if(!ENGINE_init(e)) {
      char buf[256];

      ENGINE_free(e);
      failf(data, "Failed to initialise SSL Engine '%s': %s",
            name, ossl_strerror(ERR_get_error(), buf, sizeof(buf)));
      result = CURLE_SSL_ENGINE_INITFAILED;
      e = NULL;
    }
    data->state.engine = e;
    return result;
  }
#endif
#ifdef OPENSSL_HAS_PROVIDERS
  return ossl_set_provider(data, name);
#else
  (void)name;
  failf(data, "OpenSSL engine not found");
  return CURLE_SSL_ENGINE_NOTFOUND;
#endif
}